

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::MeasuredBRDF::ToString_abi_cxx11_(string *__return_storage_ptr__,MeasuredBRDF *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  
  StringPrintf<std::__cxx11::string_const&>
            (__return_storage_ptr__,(pbrt *)"[ MeasuredBRDF filename: %s ]",(char *)&this->filename,
             in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ MeasuredBRDF filename: %s ]", filename);
    }